

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O1

int __thiscall glcts::DrawIndirectTestsGL43::init(DrawIndirectTestsGL43 *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  int extraout_EAX;
  TestSubcase *pTVar1;
  
  context = (this->super_TestCaseGroup).m_context;
  glcts::(anonymous_namespace)::DILogger::s_tcuLog = context->m_testCtx->m_log;
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,context,"advanced-twoPass-Compute-arrays",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CComputeShaderArray<glcts::(anonymous_namespace)::test_api::GL>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"advanced-twoPass-Compute-elements",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::CComputeShaderElements<glcts::(anonymous_namespace)::test_api::GL>>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  return extraout_EAX;
}

Assistant:

void DrawIndirectTestsGL43::init()
{
	using namespace glcts;

	DILogger::setOutput(m_context.getTestContext().getLog());
	addChild(new TestSubcase(m_context, "advanced-twoPass-Compute-arrays",
							 TestSubcase::Create<CComputeShaderArray<test_api::GL> >));
	addChild(new TestSubcase(m_context, "advanced-twoPass-Compute-elements",
							 TestSubcase::Create<CComputeShaderElements<test_api::GL> >));
}